

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction.cpp
# Opt level: O0

vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_> * __thiscall
cfd::core::Transaction::GetTxOutList
          (vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
           *__return_storage_ptr__,Transaction *this)

{
  bool bVar1;
  reference pTVar2;
  TxOutReference local_e8;
  undefined1 local_88 [8];
  TxOut tx_out;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> *__range2;
  Transaction *this_local;
  vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_> *refs;
  
  ::std::vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>::vector
            (__return_storage_ptr__);
  __end2 = ::std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>::begin(&this->vout_);
  tx_out.super_AbstractTxOut.locking_script_.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)::std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>::end
                          (&this->vout_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_cfd::core::TxOut_*,_std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>_>
                                     *)((long)&tx_out.super_AbstractTxOut.locking_script_.
                                               script_stack_.
                                               super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                                               ._M_impl.super__Vector_impl_data + 0x10)), bVar1) {
    pTVar2 = __gnu_cxx::
             __normal_iterator<const_cfd::core::TxOut_*,_std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>_>
             ::operator*(&__end2);
    TxOut::TxOut((TxOut *)local_88,pTVar2);
    TxOutReference::TxOutReference(&local_e8,(TxOut *)local_88);
    ::std::vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>::push_back
              (__return_storage_ptr__,&local_e8);
    TxOutReference::~TxOutReference((TxOutReference *)0x437751);
    TxOut::~TxOut((TxOut *)0x43775a);
    __gnu_cxx::
    __normal_iterator<const_cfd::core::TxOut_*,_std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>_>
    ::operator++(&__end2);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::vector<TxOutReference> Transaction::GetTxOutList() const {
  std::vector<TxOutReference> refs;
  for (TxOut tx_out : vout_) {
    refs.push_back(TxOutReference(tx_out));
  }
  return refs;
}